

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O3

uint8_t __thiscall Bus::cpuRead(Bus *this,uint16_t addr,bool bReadOnly)

{
  element_type *peVar1;
  uint uVar2;
  uint8_t uVar3;
  int iVar4;
  uint32_t mappedAddr;
  
  peVar1 = (this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = (**((peVar1->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_Mapper)();
  if ((char)iVar4 == '\0') {
    uVar2 = (uint)addr;
    if (uVar2 < 0x2000) {
      uVar3 = (this->cpuRam)._M_elems[uVar2 & 0x7ff];
    }
    else if (uVar2 < 0x4000) {
      uVar3 = m2C02::cpuRead(&this->ppu,addr & 7,bReadOnly);
    }
    else {
      uVar3 = '\0';
    }
  }
  else {
    uVar3 = *(peVar1->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  return uVar3;
}

Assistant:

uint8_t cpuRead(uint16_t addr, bool bReadOnly = false) const
  {
    uint8_t data = 0x00u;
    if (cart->cpuRead(addr, data))
    {
    }
    else if (addr >= 0x0000u && addr <= 0x1FFFu)
    {
      data = cpuRam[addr & 0x07FFu];
    }
    else if (addr >= 0x2000u && addr <= 0x3FFFu)
    {
      data = ppu.cpuRead(addr & 0x0007u, bReadOnly);
    }
    return data;
  }